

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O1

void mgr_print(chmgr *chmgr,char *fmt,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  char buf [1024];
  undefined8 local_4e8;
  void **local_4e0;
  undefined1 *local_4d8;
  undefined1 local_4c8 [16];
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined8 local_4a8;
  undefined8 local_4a0;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined8 local_438;
  undefined8 local_428;
  char local_418 [1032];
  
  local_4d8 = local_4c8;
  if (in_AL != '\0') {
    local_498 = in_XMM0_Qa;
    local_488 = in_XMM1_Qa;
    local_478 = in_XMM2_Qa;
    local_468 = in_XMM3_Qa;
    local_458 = in_XMM4_Qa;
    local_448 = in_XMM5_Qa;
    local_438 = in_XMM6_Qa;
    local_428 = in_XMM7_Qa;
  }
  local_4e0 = &ap[0].overflow_arg_area;
  local_4e8 = 0x3000000010;
  local_4b8 = in_RDX;
  local_4b0 = in_RCX;
  local_4a8 = in_R8;
  local_4a0 = in_R9;
  iVar1 = vsnprintf(local_418,0x400,fmt,&local_4e8);
  write(chmgr->fds[0].fd,local_418,(long)iVar1);
  return;
}

Assistant:

void mgr_print(struct chmgr *chmgr, const char *fmt, ...)
{
    int n;
    char buf[1024];
    va_list ap;
    va_start(ap, fmt);
    n = vsnprintf(buf, 1024, fmt, ap);
    write(chmgr->fds[CTRL_MGR].fd, buf, n);
    va_end(ap);
}